

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O2

uint32_t nd_add_m10e(uint32_t *nd,uint32_t ndhi,uint8_t m,int32_t e)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  
  if (e < 0) {
    uVar3 = (8U - e) / 9;
    uVar1 = (ulong)(0x40 - uVar3);
    iVar2 = uVar3 * 9;
  }
  else {
    uVar1 = (ulong)(uint)e / 9;
    iVar2 = (int)uVar1 * -9;
  }
  iVar2 = (ndigits_dec_threshold[iVar2 + e] + 1) * (uint)m;
  while( true ) {
    uVar3 = iVar2 + nd[uVar1];
    if (uVar3 < 1000000000) {
      nd[uVar1] = uVar3;
      return ndhi;
    }
    nd[uVar1] = uVar3 + 0xc4653600;
    if ((uint32_t)uVar1 == ndhi) break;
    uVar1 = (ulong)((uint32_t)uVar1 + 1 & 0x3f);
    iVar2 = 1;
  }
  uVar3 = ndhi + 1 & 0x3f;
  nd[uVar3] = 1;
  return uVar3;
}

Assistant:

static uint32_t nd_add_m10e(uint32_t* nd, uint32_t ndhi, uint8_t m, int32_t e)
{
  uint32_t i, carry;
  if (e >= 0) {
    i = (uint32_t)e/9;
    carry = m * (ndigits_dec_threshold[e - (int32_t)i*9] + 1);
  } else {
    int32_t f = (e-8)/9;
    i = (uint32_t)(64 + f);
    carry = m * (ndigits_dec_threshold[e - f*9] + 1);
  }
  for (;;) {
    uint32_t val = nd[i] + carry;
    if (LJ_UNLIKELY(val >= 1000000000)) {
      val -= 1000000000;
      nd[i] = val;
      if (LJ_UNLIKELY(i == ndhi)) {
	ndhi = (ndhi + 1) & 0x3f;
	nd[ndhi] = 1;
	break;
      }
      carry = 1;
      i = (i + 1) & 0x3f;
    } else {
      nd[i] = val;
      break;
    }
  }
  return ndhi;
}